

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# views_pool.cpp
# Opt level: O3

void __thiscall cppcms::views::generator::~generator(generator *this)

{
  data *pdVar1;
  pointer pcVar2;
  
  pdVar1 = (this->d).ptr_;
  if (pdVar1 != (data *)0x0) {
    operator_delete(pdVar1);
  }
  pcVar2 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->name_).field_2) {
    operator_delete(pcVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>_>
               *)this);
  return;
}

Assistant:

generator::~generator()
{
}